

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.hpp
# Opt level: O2

optional<unsigned_long_long,_0> __thiscall
cpptrace::detail::libdwarf::die_object::get_unsigned_attribute(die_object *this,Dwarf_Half attr_num)

{
  source_location location;
  int iVar1;
  Dwarf_Half in_DX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  undefined6 in_register_00000032;
  undefined8 *puVar3;
  optional<unsigned_long_long,_0> oVar4;
  raii_wrapper<Dwarf_Attribute_s_*,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gnilk[P]testrunner_build_O2__deps_cpptrace_src_src_symbols_dwarf_dwarf_hpp:161:51),_0,_0,_0>
  attwrapper;
  Dwarf_Unsigned val;
  Dwarf_Attribute attr;
  Dwarf_Error local_18;
  
  puVar3 = (undefined8 *)CONCAT62(in_register_00000032,attr_num);
  attwrapper.obj = (Dwarf_Attribute_s *)0x0;
  iVar1 = dwarf_attr((Dwarf_Die)puVar3[1],in_DX,&attr,(Dwarf_Error *)&attwrapper);
  if (iVar1 == 1) {
    handle_dwarf_error((Dwarf_Debug)*puVar3,(Dwarf_Error)attwrapper.obj);
  }
  if (iVar1 == 0) {
    attwrapper.obj = attr;
    attwrapper.deleter.holds_value = true;
    local_18 = (Dwarf_Error)0x0;
    iVar1 = dwarf_formudata(attr,&val,&local_18);
    if (iVar1 == 1) {
      handle_dwarf_error((Dwarf_Debug)*puVar3,local_18);
    }
    location.line._0_1_ = attwrapper.deleter.field_0.x;
    location.file = (char *)attwrapper.obj;
    location.line._1_1_ = attwrapper.deleter.holds_value;
    location._10_6_ = attwrapper._10_6_;
    assert_impl<bool>((detail *)(ulong)(iVar1 == 0),true,0x1e5419,
                      "optional<Dwarf_Unsigned> cpptrace::detail::libdwarf::die_object::get_unsigned_attribute(Dwarf_Half) const"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O2/_deps/cpptrace-src/src/symbols/dwarf/dwarf.hpp"
                      ,location);
    *(undefined1 *)&this->die = 1;
    this->dbg = (Dwarf_Debug)val;
    raii_wrapper<Dwarf_Attribute_s_*,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O2/_deps/cpptrace-src/src/symbols/dwarf/dwarf.hpp:161:51),_0,_0,_0>
    ::~raii_wrapper(&attwrapper);
    uVar2 = extraout_RDX_00;
  }
  else {
    *(undefined1 *)&this->die = 0;
    uVar2 = extraout_RDX;
  }
  oVar4._8_8_ = uVar2;
  oVar4.field_0 = (anon_union_8_2_d41c7fdf_for_optional<unsigned_long_long,_0>_2)this;
  return oVar4;
}

Assistant:

optional<Dwarf_Unsigned> get_unsigned_attribute(Dwarf_Half attr_num) const {
            Dwarf_Attribute attr;
            if(wrap(dwarf_attr, die, attr_num, &attr) == DW_DLV_OK) {
                auto attwrapper = raii_wrap(attr, [] (Dwarf_Attribute attr) { dwarf_dealloc_attribute(attr); });
                // Dwarf_Half form = 0;
                // VERIFY(wrap(dwarf_whatform, attr, &form) == DW_DLV_OK);
                Dwarf_Unsigned val;
                VERIFY(wrap(dwarf_formudata, attr, &val) == DW_DLV_OK);
                return val;
            } else {
                return nullopt;
            }
        }